

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::WriteMessage
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Type *type,StringPiece name,
          uint32 end_tag,bool include_start_and_end,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  size_type *psVar3;
  bool bVar4;
  uint32 uVar5;
  TypeRenderer *pp_Var6;
  Field *field;
  stringpiece_ssize_type sVar7;
  long lVar8;
  _func_int **pp_Var9;
  UnknownFieldSet *unknown_fields_00;
  undefined8 input;
  long lVar10;
  uint32 uVar11;
  uint32 tag_00;
  StringPiece name_00;
  undefined1 local_e8 [48];
  undefined1 local_b8 [48];
  undefined1 auStack_88 [8];
  UnknownFieldSet unknown_fields;
  size_type *local_60;
  string field_name;
  uint32 local_34 [2];
  uint32 tag;
  
  lVar10 = name.length_;
  input = (type->name_).ptr_;
  lVar8 = lVar10;
  pp_Var6 = FindTypeRenderer((string *)input);
  if (pp_Var6 != (TypeRenderer *)0x0) {
    (**pp_Var6)(__return_storage_ptr__,this,type,name,ow);
    return __return_storage_ptr__;
  }
  local_60 = &field_name._M_string_length;
  field_name._M_dataplus._M_p = (pointer)0x0;
  field_name._M_string_length._0_1_ = 0;
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)type;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar11 = (uint32)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar1->buffer_ = pbVar2 + 1;
      goto LAB_0033399e;
    }
  }
  else {
    uVar11 = 0;
  }
  input = pCVar1;
  uVar11 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar11);
LAB_0033399e:
  pCVar1->last_tag_ = uVar11;
  auStack_88 = (undefined1  [8])0x0;
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknown_fields.fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34[0] = uVar11;
  if (((lVar10 != 0) && (uVar11 == end_tag)) && (this->suppress_empty_object_ == true)) {
LAB_00333c2b:
    Status::Status(__return_storage_ptr__);
LAB_00333c33:
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)auStack_88);
    std::__cxx11::string::~string((string *)&local_60);
    return __return_storage_ptr__;
  }
  if (include_start_and_end) {
    input = ow;
    (*ow->_vptr_ObjectWriter[2])(ow,name.ptr_,lVar10);
  }
  uVar11 = uVar11 + 1;
  field_name.field_2._8_8_ = &__return_storage_ptr__->error_message_;
LAB_003339ee:
  field = (Field *)0x0;
LAB_003339f1:
  uVar5 = local_34[0];
  if ((local_34[0] == end_tag) || (local_34[0] == 0)) {
    if (include_start_and_end) {
      (*ow->_vptr_ObjectWriter[3])();
    }
    goto LAB_00333c2b;
  }
  if (local_34[0] == uVar11) {
    tag_00 = uVar11;
    if (field == (Field *)0x0) goto LAB_00333bc3;
  }
  else {
    field = FindAndVerifyField((ProtoStreamObjectSource *)input,
                               (Type *)unknown_fields.fields_.
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_34[0]);
    tag_00 = local_34[0];
    uVar11 = uVar5;
    if (field == (Field *)0x0) goto LAB_00333bc3;
    std::__cxx11::string::_M_assign((string *)&local_60);
  }
  psVar3 = local_60;
  if (field->cardinality_ == 3) {
    bVar4 = IsMap(this,field);
    psVar3 = local_60;
    if (bVar4) {
      sVar7 = StringPiece::CheckedSsizeTFromSizeT((size_t)field_name._M_dataplus._M_p);
      pp_Var9 = ow->_vptr_ObjectWriter;
      (*pp_Var9[2])(ow,psVar3,sVar7);
      StringPiece::CheckedSsizeTFromSizeT((size_t)field_name._M_dataplus._M_p);
      name_00.length_ = lVar8;
      name_00.ptr_ = (char *)pp_Var9;
      RenderMap((StatusOr<unsigned_int> *)local_e8,this,field,name_00,local_34[0],ow);
      DoAssignOrReturn<unsigned_int>
                (__return_storage_ptr__,local_34,(StatusOr<unsigned_int> *)local_e8);
      std::__cxx11::string::~string((string *)(local_e8 + 8));
      if (__return_storage_ptr__->error_code_ != OK) goto LAB_00333c33;
      (*ow->_vptr_ObjectWriter[3])();
    }
    else {
      lVar8 = StringPiece::CheckedSsizeTFromSizeT((size_t)field_name._M_dataplus._M_p);
      (*(this->super_ObjectSource)._vptr_ObjectSource[5])
                (local_b8,this,field,psVar3,lVar8,(ulong)local_34[0],ow);
      DoAssignOrReturn<unsigned_int>
                (__return_storage_ptr__,local_34,(StatusOr<unsigned_int> *)local_b8);
      std::__cxx11::string::~string((string *)(local_b8 + 8));
      if (__return_storage_ptr__->error_code_ != OK) goto LAB_00333c33;
    }
    input = field_name.field_2._8_8_;
    std::__cxx11::string::~string((string *)field_name.field_2._8_8_);
  }
  else {
    lVar8 = StringPiece::CheckedSsizeTFromSizeT((size_t)field_name._M_dataplus._M_p);
    (*(this->super_ObjectSource)._vptr_ObjectSource[6])
              (__return_storage_ptr__,this,field,psVar3,lVar8,ow);
    if (__return_storage_ptr__->error_code_ != OK) goto LAB_00333c33;
    input = field_name.field_2._8_8_;
    std::__cxx11::string::~string((string *)field_name.field_2._8_8_);
    pCVar1 = this->stream_;
    pbVar2 = pCVar1->buffer_;
    if (pbVar2 < pCVar1->buffer_end_) {
      uVar5 = (uint32)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_00333ba6;
      pCVar1->buffer_ = pbVar2 + 1;
    }
    else {
      uVar5 = 0;
LAB_00333ba6:
      input = pCVar1;
      uVar5 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar5);
    }
    pCVar1->last_tag_ = uVar5;
    local_34[0] = uVar5;
  }
  goto LAB_003339f1;
LAB_00333bc3:
  input = this->stream_;
  unknown_fields_00 = (UnknownFieldSet *)0x0;
  if (this->render_unknown_fields_ != false) {
    unknown_fields_00 = (UnknownFieldSet *)auStack_88;
  }
  protobuf::internal::WireFormat::SkipField((CodedInputStream *)input,tag_00,unknown_fields_00);
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar5 = (uint32)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar1->buffer_ = pbVar2 + 1;
      goto LAB_00333c0c;
    }
  }
  else {
    uVar5 = 0;
  }
  input = pCVar1;
  uVar5 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar5);
LAB_00333c0c:
  pCVar1->last_tag_ = uVar5;
  local_34[0] = uVar5;
  goto LAB_003339ee;
}

Assistant:

Status ProtoStreamObjectSource::WriteMessage(const google::protobuf::Type& type,
                                             StringPiece name,
                                             const uint32 end_tag,
                                             bool include_start_and_end,
                                             ObjectWriter* ow) const {

  const TypeRenderer* type_renderer = FindTypeRenderer(type.name());
  if (type_renderer != nullptr) {
    return (*type_renderer)(this, type, name, ow);
  }

  const google::protobuf::Field* field = nullptr;
  std::string field_name;
  // last_tag set to dummy value that is different from tag.
  uint32 tag = stream_->ReadTag(), last_tag = tag + 1;
  UnknownFieldSet unknown_fields;

  if (!name.empty() && tag == end_tag && suppress_empty_object_) {
    return util::Status();
  }

  if (include_start_and_end) {
    ow->StartObject(name);
  }
  while (tag != end_tag && tag != 0) {
    if (tag != last_tag) {  // Update field only if tag is changed.
      last_tag = tag;
      field = FindAndVerifyField(type, tag);
      if (field != nullptr) {
        if (preserve_proto_field_names_) {
          field_name = field->name();
        } else {
          field_name = field->json_name();
        }
      }
    }
    if (field == nullptr) {
      // If we didn't find a field, skip this unknown tag.
      // TODO(wpoon): Check return boolean value.
      WireFormat::SkipField(stream_, tag,
                            render_unknown_fields_ ? &unknown_fields : nullptr);
      tag = stream_->ReadTag();
      continue;
    }

    if (field->cardinality() == google::protobuf::Field::CARDINALITY_REPEATED) {
      if (IsMap(*field)) {
        ow->StartObject(field_name);
        ASSIGN_OR_RETURN(tag, RenderMap(field, field_name, tag, ow));
        ow->EndObject();
      } else {
        ASSIGN_OR_RETURN(tag, RenderList(field, field_name, tag, ow));
      }
    } else {
      // Render the field.
      RETURN_IF_ERROR(RenderField(field, field_name, ow));
      tag = stream_->ReadTag();
    }
  }


  if (include_start_and_end) {
    ow->EndObject();
  }
  return util::Status();
}